

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O3

int __thiscall
Js::ByteCodeBufferBuilder::GetString16Id
          (ByteCodeBufferBuilder *this,ByteBuffer *bb,bool isPropertyRecord)

{
  Type pSVar1;
  uint32 uVar2;
  TString16ToId *this_00;
  anon_union_8_3_52f0de8f_for_ByteBuffer_1 aVar3;
  uint uVar4;
  BufferBuilder *pBVar5;
  ImmutableList<Js::BufferBuilder_*> *pIVar6;
  BufferBuilder *pBVar7;
  ImmutableList<Js::BufferBuilder_*> *pIVar8;
  BufferBuilder **ppBVar9;
  undefined1 auStack_58 [8];
  IndexEntry indexEntry;
  ByteBuffer *local_38;
  ByteBuffer *bb_local;
  
  this_00 = this->string16ToId;
  local_38 = bb;
  uVar4 = JsUtil::
          BaseDictionary<Js::ByteBuffer*,Js::IndexEntry,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::FindEntryWithKey<Js::ByteBuffer*>
                    ((BaseDictionary<Js::ByteBuffer*,Js::IndexEntry,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)this_00,&local_38);
  if ((int)uVar4 < 0) {
    uVar2 = local_38->byteCount;
    pBVar5 = (BufferBuilder *)new<Memory::ArenaAllocator>(0x20,this->alloc,0x364470);
    aVar3 = local_38->field_1;
    pBVar5->clue = L"String16";
    pBVar5->offset = 0xffffffff;
    pBVar5->_vptr_BufferBuilder = (_func_int **)&PTR_FixOffset_014dd7e8;
    *(uint32 *)&pBVar5->field_0x14 = uVar2;
    *(anon_union_8_3_52f0de8f_for_ByteBuffer_1 *)(pBVar5 + 1) = aVar3;
    pIVar8 = (this->string16Table).list;
    pIVar6 = (ImmutableList<Js::BufferBuilder_*> *)
             new<Memory::ArenaAllocator>(0x10,this->alloc,0x364470);
    pIVar6->value = pBVar5;
    pIVar6->next = pIVar8;
    (this->string16Table).list = pIVar6;
    pIVar8 = (this->string16IndexTable).list;
    if (pIVar8 == (ImmutableList<Js::BufferBuilder_*> *)0x0) {
      pBVar7 = (BufferBuilder *)new<Memory::ArenaAllocator>(0x28,this->alloc,0x364470);
      pBVar7->clue = L"First String16 Index";
      pBVar7->offset = 0xffffffff;
      pBVar7->_vptr_BufferBuilder = (_func_int **)&PTR_FixOffset_014dd740;
      pBVar7[1]._vptr_BufferBuilder = (_func_int **)pBVar5;
      *(undefined4 *)&pBVar7[1].clue = 0;
      pIVar8 = (ImmutableList<Js::BufferBuilder_*> *)
               new<Memory::ArenaAllocator>(0x10,this->alloc,0x364470);
      pIVar8->value = pBVar7;
      pIVar8->next = (ImmutableList<Js::BufferBuilder_*> *)0x0;
      (this->string16IndexTable).list = pIVar8;
      PrependByte(this,&this->string16IndexTable,L"isPropertyRecord",isPropertyRecord);
      pIVar8 = (this->string16IndexTable).list;
    }
    ppBVar9 = regex::ImmutableList<Js::BufferBuilder_*>::First(pIVar8);
    auStack_58 = (undefined1  [8])*ppBVar9;
    pBVar7 = (BufferBuilder *)new<Memory::ArenaAllocator>(0x28,this->alloc,0x364470);
    pBVar7->clue = L"String16 Index";
    pBVar7->offset = 0xffffffff;
    pBVar7->_vptr_BufferBuilder = (_func_int **)&PTR_FixOffset_014dd740;
    pBVar7[1]._vptr_BufferBuilder = (_func_int **)pBVar5;
    *(uint32 *)&pBVar7[1].clue = uVar2;
    pIVar8 = (this->string16IndexTable).list;
    pIVar6 = (ImmutableList<Js::BufferBuilder_*> *)
             new<Memory::ArenaAllocator>(0x10,this->alloc,0x364470);
    pIVar6->value = pBVar7;
    pIVar6->next = pIVar8;
    (this->string16IndexTable).list = pIVar6;
    PrependByte(this,&this->string16IndexTable,L"isPropertyRecord",'\0');
    indexEntry.isPropertyRecord =
         (BufferBuilderByte *)CONCAT44(indexEntry.isPropertyRecord._4_4_,this->nextString16Id);
    JsUtil::
    BaseDictionary<Js::ByteBuffer*,Js::IndexEntry,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
    ::
    Insert<(JsUtil::BaseDictionary<Js::ByteBuffer*,Js::IndexEntry,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
              ((BaseDictionary<Js::ByteBuffer*,Js::IndexEntry,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                *)this->string16ToId,&local_38,(IndexEntry *)auStack_58);
    this->nextString16Id = this->nextString16Id + 1;
  }
  else {
    pSVar1 = this_00->entries + uVar4;
    auStack_58 = (undefined1  [8])
                 (pSVar1->
                 super_DefaultHashedEntry<Js::ByteBuffer_*,_Js::IndexEntry,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                 ).super_KeyValueEntry<Js::ByteBuffer_*,_Js::IndexEntry>.
                 super_ValueEntry<Js::IndexEntry,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::ByteBuffer_*,_Js::IndexEntry>_>
                 .super_KeyValueEntryDataLayout2<Js::ByteBuffer_*,_Js::IndexEntry>.value.
                 isPropertyRecord;
    indexEntry.isPropertyRecord =
         *(BufferBuilderByte **)
          &(pSVar1->
           super_DefaultHashedEntry<Js::ByteBuffer_*,_Js::IndexEntry,_JsUtil::(anonymous_namespace)::KeyValueEntry>
           ).super_KeyValueEntry<Js::ByteBuffer_*,_Js::IndexEntry>.
           super_ValueEntry<Js::IndexEntry,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::ByteBuffer_*,_Js::IndexEntry>_>
           .super_KeyValueEntryDataLayout2<Js::ByteBuffer_*,_Js::IndexEntry>.value.id;
  }
  if (isPropertyRecord) {
    *(bool *)((long)auStack_58 + 0x14) = isPropertyRecord;
  }
  return (int)indexEntry.isPropertyRecord;
}

Assistant:

int GetString16Id(ByteBuffer * bb, bool isPropertyRecord = false)
    {
        IndexEntry indexEntry;
        if (!string16ToId->TryGetValue(bb, &indexEntry))
        {
            auto sizeInBytes = bb->byteCount;
            auto stringEntry = Anew(alloc, BufferBuilderRaw, _u("String16"), sizeInBytes, (const byte *)bb->pv); // Writing the terminator even though it is computable so that this memory can be used as-is when deserialized
            string16Table.list = string16Table.list->Prepend(stringEntry, alloc);
            if (string16IndexTable.list == nullptr)
            {
                // First item in the list is the first string.
                auto stringIndexEntry = Anew(alloc, BufferBuilderRelativeOffset, _u("First String16 Index"), stringEntry);
                string16IndexTable.list = regex::ImmutableList<Js::BufferBuilder*>::OfSingle(stringIndexEntry, alloc);
                PrependByte(string16IndexTable, _u("isPropertyRecord"), (BYTE)isPropertyRecord);
            }

            // Get a pointer to the previous entry of isPropertyRecord
            indexEntry.isPropertyRecord = static_cast<BufferBuilderByte*>(string16IndexTable.list->First());

            // Subsequent strings indexes point one past the end. This way, the size is always computable by subtracting indexes.
            auto stringIndexEntry = Anew(alloc, BufferBuilderRelativeOffset, _u("String16 Index"), stringEntry, sizeInBytes);
            string16IndexTable.list = string16IndexTable.list->Prepend(stringIndexEntry, alloc);

            // By default, mark the next string to be not a property record.
            PrependByte(string16IndexTable, _u("isPropertyRecord"), (BYTE)false);

            indexEntry.id = nextString16Id;
            string16ToId->Add(bb, indexEntry);
            ++nextString16Id;
        }
        // A string might start off as not being a property record and later becoming one. Hence,
        // we set only if the transition is from false => true. Once it is a property record, it cannot go back.
        if(isPropertyRecord)
        {
            indexEntry.isPropertyRecord->value = isPropertyRecord;
        }
        return indexEntry.id;
    }